

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<unsigned_short>::~abstract_value
          (abstract_value<unsigned_short> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__abstract_value_001b48d0;
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::shared_ptr<unsigned_short>::~shared_ptr((shared_ptr<unsigned_short> *)0x17abf6);
  Value::~Value((Value *)0x17ac00);
  return;
}

Assistant:

virtual ~abstract_value() = default;